

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O0

void fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(uint64_t *out1,uint64_t *arg1)

{
  uint64_t *in_RSI;
  undefined8 *in_RDI;
  uint64_t x183;
  uint64_t x182;
  uint64_t x181;
  uint64_t x180;
  uint64_t x179;
  uint64_t x178;
  uint64_t x177;
  uint64_t x176;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x175;
  uint64_t x174;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x173;
  uint64_t x172;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x171;
  uint64_t x170;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x169;
  uint64_t x168;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x167;
  uint64_t x166;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x165;
  uint64_t x164;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x163;
  uint64_t x162;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x161;
  uint64_t x160;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x159;
  uint64_t x158;
  uint64_t x157;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x156;
  uint64_t x155;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x154;
  uint64_t x153;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x152;
  uint64_t x151;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x150;
  uint64_t x149;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x148;
  uint64_t x147;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x146;
  uint64_t x145;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x144;
  uint64_t x143;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x142;
  uint64_t x141;
  uint64_t x140;
  uint64_t x139;
  uint64_t x138;
  uint64_t x137;
  uint64_t x136;
  uint64_t x135;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x134;
  uint64_t x133;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x132;
  uint64_t x131;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x130;
  uint64_t x129;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x128;
  uint64_t x127;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x126;
  uint64_t x125;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x124;
  uint64_t x123;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x122;
  uint64_t x121;
  uint64_t x120;
  uint64_t x119;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x118;
  uint64_t x117;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x116;
  uint64_t x115;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x114;
  uint64_t x113;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x112;
  uint64_t x111;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x110;
  uint64_t x109;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x108;
  uint64_t x107;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x106;
  uint64_t x105;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x104;
  uint64_t x103;
  uint64_t x102;
  uint64_t x101;
  uint64_t x100;
  uint64_t x99;
  uint64_t x98;
  uint64_t x97;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x96;
  uint64_t x95;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x94;
  uint64_t x93;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x92;
  uint64_t x91;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x90;
  uint64_t x89;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x88;
  uint64_t x87;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x86;
  uint64_t x85;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x84;
  uint64_t x83;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x82;
  uint64_t x81;
  uint64_t x80;
  uint64_t x79;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x78;
  uint64_t x77;
  uint64_t x76;
  uint64_t x75;
  uint64_t x74;
  uint64_t x73;
  uint64_t x72;
  uint64_t x71;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x70;
  uint64_t x69;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x68;
  uint64_t x67;
  uint64_t x66;
  uint64_t x65;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x64;
  uint64_t x63;
  uint64_t x62;
  uint64_t x61;
  uint64_t x60;
  uint64_t x59;
  uint64_t x58;
  uint64_t x57;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x56;
  uint64_t x55;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x54;
  uint64_t x53;
  uint64_t x52;
  uint64_t x51;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x50;
  uint64_t x49;
  uint64_t x48;
  uint64_t x47;
  uint64_t x46;
  uint64_t x45;
  uint64_t x44;
  uint64_t x43;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x42;
  uint64_t x41;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x40;
  uint64_t x39;
  uint64_t x38;
  uint64_t x37;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x36;
  uint64_t x35;
  uint64_t x34;
  uint64_t x33;
  uint64_t x32;
  uint64_t x31;
  uint64_t x30;
  uint64_t x29;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x28;
  uint64_t x27;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x26;
  uint64_t x25;
  uint64_t x24;
  uint64_t x23;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x22;
  uint64_t x21;
  uint64_t x20;
  uint64_t x19;
  uint64_t x18;
  uint64_t x17;
  uint64_t x16;
  uint64_t x15;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x14;
  uint64_t x13;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x12;
  uint64_t x11;
  uint64_t x10;
  uint64_t x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined8 local_5b0;
  uint64_t in_stack_fffffffffffffa58;
  uint64_t in_stack_fffffffffffffa60;
  undefined7 local_598;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 in_stack_fffffffffffffa6f;
  uint64_t *in_stack_fffffffffffffa70;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_581;
  uint64_t local_580;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_571;
  uint64_t local_570;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_561;
  uint64_t local_560;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_551;
  uint64_t local_550;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_541;
  uint64_t local_540;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_531;
  uint64_t local_530;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_521;
  uint64_t local_520;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_511;
  uint64_t local_510;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_501;
  uint64_t local_500;
  uint64_t local_4f8;
  byte local_4e9;
  uint64_t local_4e8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_4d9;
  uint64_t local_4d8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_4c9;
  uint64_t local_4c8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_4b9;
  uint64_t local_4b8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_4a9;
  uint64_t local_4a8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_499;
  uint64_t local_498;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_489;
  uint64_t local_488;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_479;
  uint64_t local_478;
  uint64_t local_470;
  uint64_t local_468;
  uint64_t local_460;
  uint64_t local_458;
  uint64_t local_450;
  uint64_t local_448;
  byte local_439;
  uint64_t local_438;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_429;
  uint64_t local_428;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_419;
  uint64_t local_418;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_409;
  uint64_t local_408;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_3f9;
  uint64_t local_3f8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_3e9;
  uint64_t local_3e8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_3d9;
  uint64_t local_3d8;
  uint64_t local_3d0;
  uint64_t local_3c8;
  byte local_3b9;
  uint64_t local_3b8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_3a9;
  uint64_t local_3a8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_399;
  uint64_t local_398;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_389;
  uint64_t local_388;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_379;
  uint64_t local_378;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_369;
  uint64_t local_368;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_359;
  uint64_t local_358;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_349;
  uint64_t local_348;
  uint64_t local_340;
  uint64_t local_338;
  uint64_t local_330;
  uint64_t local_328;
  uint64_t local_320;
  uint64_t local_318;
  byte local_309;
  uint64_t local_308;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_2f9;
  uint64_t local_2f8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_2e9;
  uint64_t local_2e8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_2d9;
  uint64_t local_2d8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_2c9;
  uint64_t local_2c8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_2b9;
  uint64_t local_2b8;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 local_2a9;
  uint64_t local_2a8;
  byte local_299;
  uint64_t local_298;
  uint64_t local_290;
  uint64_t local_288;
  byte local_279;
  uint64_t local_278;
  uint64_t local_270;
  uint64_t local_268;
  uint64_t local_260;
  uint64_t local_258;
  uint64_t local_250;
  uint64_t local_248;
  byte local_239;
  uint64_t local_238;
  byte local_229;
  uint64_t local_228;
  uint64_t local_220;
  uint64_t local_218;
  byte local_209;
  uint64_t local_208;
  uint64_t local_200;
  uint64_t local_1f8;
  uint64_t local_1f0;
  uint64_t local_1e8;
  uint64_t local_1e0;
  uint64_t local_1d8;
  byte local_1c9;
  uint64_t local_1c8;
  byte local_1b9;
  uint64_t local_1b8;
  uint64_t local_1b0;
  uint64_t local_1a8;
  byte local_199;
  uint64_t local_198;
  uint64_t local_190;
  uint64_t local_188;
  uint64_t local_180;
  uint64_t local_178;
  uint64_t local_170;
  uint64_t local_168;
  byte local_159;
  uint64_t local_158;
  byte local_149;
  uint64_t local_148;
  uint64_t local_140;
  uint64_t local_138;
  byte local_129;
  uint64_t local_128;
  uint64_t local_120;
  uint64_t local_118;
  uint64_t local_110;
  uint64_t local_108;
  uint64_t local_100;
  uint64_t local_f8;
  byte local_e9;
  uint64_t local_e8;
  byte local_d9;
  uint64_t local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  byte local_b9;
  uint64_t local_b8;
  uint64_t local_b0;
  uint64_t local_a8;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t local_88;
  byte local_79;
  uint64_t local_78;
  byte local_69;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t local_18;
  uint64_t *local_10;
  undefined8 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_18,&local_20,*in_RSI,0xc084);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_28,&local_30,local_18,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_38,&local_40,local_28,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_48,&local_50,local_28,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_58,&local_60,local_10[1],0xc084);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_68,&local_69,'\0',local_18,local_48);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_78,&local_79,'\0',local_69 + local_20 + local_50,local_58);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_88,&local_90,local_78,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_98,&local_a0,local_88,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_a8,&local_b0,local_88,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_b8,&local_b9,'\0',local_40,local_98);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_c8,&local_d0,local_10[2],0xc084);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_d8,&local_d9,'\0',local_78,local_a8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_e8,&local_e9,'\0',(ulong)local_d9 + local_79 + local_60 + local_b0,local_c8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_f8,&local_100,local_e8,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_108,&local_110,local_f8,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_118,&local_120,local_f8,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_128,&local_129,'\0',local_b9 + local_a0,local_108);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_138,&local_140,local_10[3],0xc084);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_148,&local_149,'\0',local_e8,local_118);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_158,&local_159,'\0',(ulong)local_149 + local_e9 + local_d0 + local_120,local_138
            );
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_168,&local_170,local_158,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_178,&local_180,local_168,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_188,&local_190,local_168,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_198,&local_199,'\0',local_129 + local_110,local_178);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_1a8,&local_1b0,local_10[4],0xc084);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_1b8,&local_1b9,'\0',local_158,local_188);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_1c8,&local_1c9,'\0',(ulong)local_1b9 + local_159 + local_140 + local_190,
             local_1a8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_1d8,&local_1e0,local_1c8,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_1e8,&local_1f0,local_1d8,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_1f8,&local_200,local_1d8,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_208,&local_209,'\0',local_199 + local_180,local_1e8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_218,&local_220,local_10[5],0xc084);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_228,&local_229,'\0',local_1c8,local_1f8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_238,&local_239,'\0',(ulong)local_229 + local_1c9 + local_1b0 + local_200,
             local_218);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_248,&local_250,local_238,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_258,&local_260,local_248,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_268,&local_270,local_248,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_278,&local_279,'\0',local_209 + local_1f0,local_258);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_288,&local_290,local_10[6],0xc084);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_298,&local_299,'\0',local_238,local_268);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_2a8,&local_2a9,'\0',(ulong)local_299 + local_239 + local_220 + local_270,
             local_288);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_2b8,&local_2b9,local_2a9,local_38,local_290);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_2c8,&local_2c9,local_2b9,local_b8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_2d8,&local_2d9,local_2c9,local_128,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_2e8,&local_2e9,local_2d9,local_198,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_2f8,&local_2f9,local_2e9,local_208,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_308,&local_309,local_2f9,local_278,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_318,&local_320,local_2a8,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_328,&local_330,local_318,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_338,&local_340,local_318,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_348,&local_349,'\0',local_2a8,local_338);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_358,&local_359,local_349,local_2b8,local_340);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_368,&local_369,local_359,local_2c8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_378,&local_379,local_369,local_2d8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_388,&local_389,local_379,local_2e8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_398,&local_399,local_389,local_2f8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_3a8,&local_3a9,local_399,local_308,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_3b8,&local_3b9,local_3a9,(ulong)local_309 + local_279 + local_260,local_328);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_3c8,&local_3d0,local_10[7],0xc084);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_3d8,&local_3d9,'\0',local_358,local_3c8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_3e8,&local_3e9,local_3d9,local_368,local_3d0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_3f8,&local_3f9,local_3e9,local_378,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_408,&local_409,local_3f9,local_388,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_418,&local_419,local_409,local_398,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_428,&local_429,local_419,local_3a8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_438,&local_439,local_429,local_3b8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_448,&local_450,local_3d8,0x4e6a171024e6a171);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64
            (&local_458,&local_460,local_448,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&local_468,&local_470,local_448,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_478,&local_479,'\0',local_3d8,local_468);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_488,&local_489,local_479,local_3e8,local_470);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_498,&local_499,local_489,local_3f8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_4a8,&local_4a9,local_499,local_408,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_4b8,&local_4b9,local_4a9,local_418,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_4c8,&local_4c9,local_4b9,local_428,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_4d8,&local_4d9,local_4c9,local_438,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64
            (&local_4e8,&local_4e9,local_4d9,(ulong)local_439 + local_3b9 + local_330,local_458);
  local_4f8 = local_4e9 + local_460;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_500,&local_501,'\0',local_488,0x6f);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_510,&local_511,local_501,local_498,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_520,&local_521,local_511,local_4a8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_530,&local_531,local_521,local_4b8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_540,&local_541,local_531,local_4c8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_550,&local_551,local_541,local_4d8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_560,&local_561,local_551,local_4e8,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64
            (&local_570,&local_571,local_561,local_4f8,0x8000000000000000);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&local_580,&local_581,local_571,0,0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f,in_stack_fffffffffffffa60,
             in_stack_fffffffffffffa58);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f,in_stack_fffffffffffffa60,
             in_stack_fffffffffffffa58);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f,in_stack_fffffffffffffa60,
             in_stack_fffffffffffffa58);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f,in_stack_fffffffffffffa60,
             in_stack_fffffffffffffa58);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f,in_stack_fffffffffffffa60,
             in_stack_fffffffffffffa58);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f,in_stack_fffffffffffffa60,
             in_stack_fffffffffffffa58);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f,in_stack_fffffffffffffa60,
             in_stack_fffffffffffffa58);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa6f,in_stack_fffffffffffffa60,
             in_stack_fffffffffffffa58);
  *local_8 = in_stack_fffffffffffffa70;
  local_8[1] = CONCAT17(in_stack_fffffffffffffa6f,local_598);
  local_8[2] = in_stack_fffffffffffffa60;
  local_8[3] = in_stack_fffffffffffffa58;
  local_8[4] = local_5b0;
  local_8[5] = local_5b8;
  local_8[6] = local_5c0;
  local_8[7] = local_5c8;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(
    uint64_t out1[8], const uint64_t arg1[8]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x12;
    uint64_t x13;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x14;
    uint64_t x15;
    uint64_t x16;
    uint64_t x17;
    uint64_t x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x26;
    uint64_t x27;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x28;
    uint64_t x29;
    uint64_t x30;
    uint64_t x31;
    uint64_t x32;
    uint64_t x33;
    uint64_t x34;
    uint64_t x35;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x40;
    uint64_t x41;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x42;
    uint64_t x43;
    uint64_t x44;
    uint64_t x45;
    uint64_t x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x54;
    uint64_t x55;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x56;
    uint64_t x57;
    uint64_t x58;
    uint64_t x59;
    uint64_t x60;
    uint64_t x61;
    uint64_t x62;
    uint64_t x63;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x64;
    uint64_t x65;
    uint64_t x66;
    uint64_t x67;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x68;
    uint64_t x69;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x70;
    uint64_t x71;
    uint64_t x72;
    uint64_t x73;
    uint64_t x74;
    uint64_t x75;
    uint64_t x76;
    uint64_t x77;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x78;
    uint64_t x79;
    uint64_t x80;
    uint64_t x81;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x82;
    uint64_t x83;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x84;
    uint64_t x85;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x86;
    uint64_t x87;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x88;
    uint64_t x89;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x90;
    uint64_t x91;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x92;
    uint64_t x93;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x94;
    uint64_t x95;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x96;
    uint64_t x97;
    uint64_t x98;
    uint64_t x99;
    uint64_t x100;
    uint64_t x101;
    uint64_t x102;
    uint64_t x103;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x104;
    uint64_t x105;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x106;
    uint64_t x107;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x108;
    uint64_t x109;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x110;
    uint64_t x111;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x112;
    uint64_t x113;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x114;
    uint64_t x115;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x116;
    uint64_t x117;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x118;
    uint64_t x119;
    uint64_t x120;
    uint64_t x121;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x122;
    uint64_t x123;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x124;
    uint64_t x125;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x126;
    uint64_t x127;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x128;
    uint64_t x129;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x130;
    uint64_t x131;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x132;
    uint64_t x133;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x134;
    uint64_t x135;
    uint64_t x136;
    uint64_t x137;
    uint64_t x138;
    uint64_t x139;
    uint64_t x140;
    uint64_t x141;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x142;
    uint64_t x143;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x144;
    uint64_t x145;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x146;
    uint64_t x147;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x148;
    uint64_t x149;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x150;
    uint64_t x151;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x152;
    uint64_t x153;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x154;
    uint64_t x155;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x156;
    uint64_t x157;
    uint64_t x158;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x159;
    uint64_t x160;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x161;
    uint64_t x162;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x163;
    uint64_t x164;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x165;
    uint64_t x166;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x167;
    uint64_t x168;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x169;
    uint64_t x170;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x171;
    uint64_t x172;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x173;
    uint64_t x174;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x175;
    uint64_t x176;
    uint64_t x177;
    uint64_t x178;
    uint64_t x179;
    uint64_t x180;
    uint64_t x181;
    uint64_t x182;
    uint64_t x183;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x1, &x2, (arg1[0]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x3, &x4, x1, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x5, &x6, x3, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x7, &x8, x3,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x9, &x10, (arg1[1]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x11, &x12, 0x0, x1,
                                                            x7);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x13, &x14, 0x0, ((x12 + x2) + x8), x9);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x15, &x16, x13, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x17, &x18, x15, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x19, &x20, x15,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x21, &x22, 0x0, x6,
                                                            x17);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x23, &x24, (arg1[2]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x25, &x26, 0x0,
                                                            x13, x19);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x27, &x28, 0x0, ((x26 + (x14 + x10)) + x20), x23);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x29, &x30, x27, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x31, &x32, x29, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x33, &x34, x29,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x35, &x36, 0x0,
                                                            (x22 + x18), x31);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x37, &x38, (arg1[3]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x39, &x40, 0x0,
                                                            x27, x33);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x41, &x42, 0x0, ((x40 + (x28 + x24)) + x34), x37);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x43, &x44, x41, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x45, &x46, x43, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x47, &x48, x43,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x49, &x50, 0x0,
                                                            (x36 + x32), x45);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x51, &x52, (arg1[4]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x53, &x54, 0x0,
                                                            x41, x47);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x55, &x56, 0x0, ((x54 + (x42 + x38)) + x48), x51);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x57, &x58, x55, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x59, &x60, x57, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x61, &x62, x57,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x63, &x64, 0x0,
                                                            (x50 + x46), x59);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x65, &x66, (arg1[5]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x67, &x68, 0x0,
                                                            x55, x61);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x69, &x70, 0x0, ((x68 + (x56 + x52)) + x62), x65);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x71, &x72, x69, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x73, &x74, x71, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x75, &x76, x71,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x77, &x78, 0x0,
                                                            (x64 + x60), x73);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x79, &x80, (arg1[6]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x81, &x82, 0x0,
                                                            x69, x75);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x83, &x84, 0x0, ((x82 + (x70 + x66)) + x76), x79);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x85, &x86, x84, x5,
                                                            x80);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x87, &x88, x86,
                                                            x21, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x89, &x90, x88,
                                                            x35, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x91, &x92, x90,
                                                            x49, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x93, &x94, x92,
                                                            x63, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x95, &x96, x94,
                                                            x77, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x97, &x98, x83, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x99, &x100, x97, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x101, &x102, x97,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x103, &x104, 0x0,
                                                            x83, x101);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x105, &x106, x104,
                                                            x85, x102);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x107, &x108, x106,
                                                            x87, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x109, &x110, x108,
                                                            x89, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x111, &x112, x110,
                                                            x91, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x113, &x114, x112,
                                                            x93, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x115, &x116, x114,
                                                            x95, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x117, &x118, x116, (x96 + (x78 + x74)), x99);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x119, &x120, (arg1[7]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x121, &x122, 0x0,
                                                            x105, x119);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x123, &x124, x122,
                                                            x107, x120);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x125, &x126, x124,
                                                            x109, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x127, &x128, x126,
                                                            x111, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x129, &x130, x128,
                                                            x113, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x131, &x132, x130,
                                                            x115, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x133, &x134, x132,
                                                            x117, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x135, &x136, x121, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x137, &x138, x135, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x139, &x140, x135,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x141, &x142, 0x0,
                                                            x121, x139);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x143, &x144, x142,
                                                            x123, x140);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x145, &x146, x144,
                                                            x125, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x147, &x148, x146,
                                                            x127, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x149, &x150, x148,
                                                            x129, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x151, &x152, x150,
                                                            x131, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x153, &x154, x152,
                                                            x133, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x155, &x156, x154, (x134 + (x118 + x100)), x137);
    x157 = (x156 + x138);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(
        &x158, &x159, 0x0, x143, UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x160, &x161, x159,
                                                             x145, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x162, &x163, x161,
                                                             x147, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x164, &x165, x163,
                                                             x149, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x166, &x167, x165,
                                                             x151, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x168, &x169, x167,
                                                             x153, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x170, &x171, x169,
                                                             x155, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(
        &x172, &x173, x171, x157, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x174, &x175, x173,
                                                             0x0, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x176, x175, x158,
                                                          x143);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x177, x175, x160,
                                                          x145);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x178, x175, x162,
                                                          x147);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x179, x175, x164,
                                                          x149);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x180, x175, x166,
                                                          x151);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x181, x175, x168,
                                                          x153);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x182, x175, x170,
                                                          x155);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x183, x175, x172,
                                                          x157);
    out1[0] = x176;
    out1[1] = x177;
    out1[2] = x178;
    out1[3] = x179;
    out1[4] = x180;
    out1[5] = x181;
    out1[6] = x182;
    out1[7] = x183;
}